

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlib.c
# Opt level: O0

void cxpose(float *indata,long iRsiz,float *outdata,long oRsiz,long Nrows,long Ncols)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  long in_R8;
  long in_R9;
  float *irow;
  long inRsizd4;
  long inRsizd3i;
  long inRsizd3;
  long inRsizd2i;
  long inRsizd2;
  long inRsizd1i;
  long inRsizd1;
  float T3i;
  float T3r;
  float T2i;
  float T2r;
  float T1i;
  float T1r;
  float T0i;
  float T0r;
  long ColCnt;
  long RowCnt;
  float *odata;
  float *idata;
  float *ocol;
  
  _T2i = in_RDX;
  _T1i = in_RDI;
  for (inRsizd1i = in_R8 / 4; inRsizd2 = in_R9, 0 < inRsizd1i; inRsizd1i = inRsizd1i + -1) {
    _T3i = _T1i;
    inRsizd1 = _T2i;
    for (; 0 < inRsizd2; inRsizd2 = inRsizd2 + -1) {
      uVar1 = _T3i[1];
      uVar2 = _T3i[in_RSI * 2];
      uVar3 = _T3i[in_RSI * 2 + 1];
      uVar4 = _T3i[in_RSI * 4];
      uVar5 = _T3i[in_RSI * 4 + 1];
      uVar6 = _T3i[in_RSI * 6];
      uVar7 = _T3i[in_RSI * 6 + 1];
      *(undefined4 *)inRsizd1 = *_T3i;
      *(undefined4 *)(inRsizd1 + 4) = uVar1;
      *(undefined4 *)(inRsizd1 + 8) = uVar2;
      *(undefined4 *)(inRsizd1 + 0xc) = uVar3;
      *(undefined4 *)(inRsizd1 + 0x10) = uVar4;
      *(undefined4 *)(inRsizd1 + 0x14) = uVar5;
      *(undefined4 *)(inRsizd1 + 0x18) = uVar6;
      *(undefined4 *)(inRsizd1 + 0x1c) = uVar7;
      _T3i = _T3i + 2;
      inRsizd1 = in_RCX * 8 + inRsizd1;
    }
    _T1i = _T1i + in_RSI * 8;
    _T2i = _T2i + 0x20;
  }
  if (in_R8 % 4 != 0) {
    for (; 0 < inRsizd2; inRsizd2 = inRsizd2 + -1) {
      _T3i = _T1i;
      inRsizd1 = _T2i;
      for (inRsizd1i = in_R8 % 4; 0 < inRsizd1i; inRsizd1i = inRsizd1i + -1) {
        uVar1 = _T3i[1];
        *(undefined4 *)inRsizd1 = *_T3i;
        *(undefined4 *)(inRsizd1 + 4) = uVar1;
        inRsizd1 = inRsizd1 + 8;
        _T3i = _T3i + in_RSI * 2;
      }
      _T1i = _T1i + 2;
      _T2i = in_RCX * 8 + _T2i;
    }
  }
  return;
}

Assistant:

void cxpose(float *indata, long iRsiz, float *outdata, long oRsiz, long Nrows, long Ncols){
/* not in-place complex float matrix transpose	*/
/* INPUTS */
/* *indata = input data array	*/
/* iRsiz = offset to between rows of input data array	*/
/* oRsiz = offset to between rows of output data array	*/
/* Nrows = number of rows in input data array	*/
/* Ncols = number of columns in input data array	*/
/* OUTPUTS */
/* *outdata = output data array	*/

float	*irow; 		/* pointer to input row start */
float	*ocol; 		/* pointer to output col start */
float	*idata; 	/* pointer to input data */
float	*odata; 	/* pointer to output data */
long 	RowCnt;		/* row counter */
long 	ColCnt;		/* col counter */
float	T0r; 		/* data storage */
float	T0i; 		/* data storage */
float	T1r; 		/* data storage */
float	T1i; 		/* data storage */
float	T2r; 		/* data storage */
float	T2i; 		/* data storage */
float	T3r; 		/* data storage */
float	T3i; 		/* data storage */
const long inRsizd1 = 2*iRsiz;
const long inRsizd1i = 2*iRsiz + 1;
const long inRsizd2 = 4*iRsiz;
const long inRsizd2i = 4*iRsiz + 1;
const long inRsizd3 = inRsizd2+inRsizd1;
const long inRsizd3i = inRsizd2+inRsizd1 + 1;
const long inRsizd4 = 8*iRsiz;

ocol = outdata;
irow = indata;
for (RowCnt=Nrows/4; RowCnt>0; RowCnt--){
	idata = irow;
	odata = ocol;
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		T0r = *idata;
		T0i = *(idata +1);
		T1r = *(idata+inRsizd1);
		T1i = *(idata+inRsizd1i);
		T2r = *(idata+inRsizd2);
		T2i = *(idata+inRsizd2i);
		T3r = *(idata+inRsizd3);
		T3i = *(idata+inRsizd3i);
		*odata = T0r;
		*(odata+1) = T0i;
		*(odata+2) = T1r;
		*(odata+3) = T1i;
		*(odata+4) = T2r;
		*(odata+5) = T2i;
		*(odata+6) = T3r;
		*(odata+7) = T3i;
		idata+=2;
		odata += 2*oRsiz;
	}
	irow += inRsizd4;
	ocol += 8;
}
if (Nrows%4 != 0){
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		idata = irow;
		odata = ocol;
		for (RowCnt=Nrows%4; RowCnt>0; RowCnt--){
			T0r = *idata;
			T0i = *(idata+1);
			*odata = T0r;
			*(odata+1) = T0i;
			odata+=2;
			idata += 2*iRsiz;
		}
		irow+=2;
		ocol += 2*oRsiz;
	}
}
}